

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
::
Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
          (Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
           *this,Index columnIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,Dimension dimension
          ,map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
           *rowContainer,Column_settings *colSettings)

{
  ID_index *pIVar1;
  Index position;
  ID_index *pIVar2;
  allocator_type local_39;
  value_type local_38;
  
  *(Index *)this = columnIndex;
  *(map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
    **)(this + 8) = rowContainer;
  *(Dimension *)(this + 0x10) = dimension;
  local_38 = (value_type)0x0;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
  ::vector((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
            *)(this + 0x18),
           (long)(nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2,&local_38,&local_39);
  *(Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
    **)(this + 0x30) = this + 0x60;
  *(undefined8 *)(this + 0x38) = 1;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined4 *)(this + 0x50) = 0x3f800000;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  *(Column_settings **)(this + 0x70) = colSettings;
  pIVar1 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  position = 0;
  for (pIVar2 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start; pIVar2 != pIVar1; pIVar2 = pIVar2 + 1) {
    Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
    ::_update_entry((Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                     *)this,*pIVar2,position);
    position = position + 1;
  }
  return;
}

Assistant:

inline Vector_column<Master_matrix>::Vector_column(Index columnIndex,
                                                   const Container& nonZeroRowIndices,
                                                   Dimension dimension,
                                                   Row_container* rowContainer,
                                                   Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      column_(nonZeroRowIndices.size(), nullptr),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }

  Index i = 0;
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _update_entry(id, i++);
    }
  } else {
    for (const auto& p : nonZeroRowIndices) {
      _update_entry(operators_->get_value(p.second), p.first, i++);
    }
  }
}